

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeTypeCase::test
          (VertexAttributeTypeCase *this)

{
  CallLogWrapper *this_00;
  TestLog *pTVar1;
  long lVar2;
  GLenum GVar3;
  GLenum reference;
  ScopedLogSection section;
  GLfloat vertexData [4];
  PointerData pointers [11];
  ScopedLogSection local_160;
  string local_158;
  string local_138;
  undefined4 local_118;
  undefined1 local_114;
  string *local_110;
  undefined8 local_108;
  undefined4 local_100;
  undefined1 local_fc;
  string *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined1 local_e4;
  string *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined1 local_cc;
  string *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined1 local_b4;
  string *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined1 local_9c;
  string *local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined1 local_84;
  string *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined1 local_6c;
  string *local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined1 local_54;
  string *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  string *local_38;
  
  pTVar1 = (this->super_ApiCase).m_log;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"DefaultVAO","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_160,pTVar1,&local_138,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 0;
  local_138._M_dataplus._M_p = (pointer)0x140000000001;
  local_138._M_string_length._0_4_ = 0;
  local_138._M_string_length._4_1_ = 0;
  local_138.field_2._M_allocated_capacity = (size_type)&local_158;
  local_138.field_2._8_8_ = 0x140200000001;
  local_118 = 0;
  local_114 = 0;
  local_110 = &local_158;
  local_108 = 0x140400000001;
  local_100 = 0;
  local_fc = 0;
  local_f8 = &local_158;
  local_f0 = 0x140c00000001;
  local_e8 = 0;
  local_e4 = 0;
  local_e0 = &local_158;
  local_d8 = 0x140600000001;
  local_d0 = 0;
  local_cc = 0;
  local_c8 = &local_158;
  local_c0 = 0x140b00000001;
  local_b8 = 0;
  local_b4 = 0;
  local_b0 = &local_158;
  local_a8 = 0x140100000001;
  local_a0 = 0;
  local_9c = 0;
  local_98 = &local_158;
  local_90 = 0x140300000001;
  local_88 = 0;
  local_84 = 0;
  local_80 = &local_158;
  local_78 = 0x140500000001;
  local_70 = 0;
  local_6c = 0;
  local_68 = &local_158;
  local_60 = 0x8d9f00000004;
  local_58 = 0;
  local_54 = 0;
  local_50 = &local_158;
  local_48 = 0x836800000004;
  local_40 = 0;
  local_3c = 0;
  local_38 = &local_158;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar2 = 0x10;
  do {
    GVar3 = (GLenum)(byte)local_158.field_2._M_local_buf[lVar2 + 0xc];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)&local_158.field_2 + lVar2),
               *(GLenum *)((long)&local_158.field_2 + lVar2 + 4),
               local_158.field_2._M_local_buf[lVar2 + 0xc],
               *(GLsizei *)((long)&local_158.field_2 + lVar2 + 8),
               *(void **)((long)&local_138._M_dataplus._M_p + lVar2));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8625,*(GLenum *)((long)&local_158.field_2 + lVar2 + 4),GVar3);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x118);
  local_138._M_dataplus._M_p = (pointer)0x140000000001;
  local_138._M_string_length._0_4_ = 0;
  local_138._M_string_length._4_1_ = 0;
  local_138.field_2._M_allocated_capacity = (size_type)&local_158;
  local_138.field_2._8_8_ = 0x140200000001;
  local_118 = 0;
  local_114 = 0;
  local_110 = &local_158;
  local_108 = 0x140400000001;
  local_100 = 0;
  local_fc = 0;
  local_f8 = &local_158;
  local_f0 = 0x140100000001;
  local_e8 = 0;
  local_e4 = 0;
  local_e0 = &local_158;
  local_d8 = 0x140300000001;
  local_d0 = 0;
  local_cc = 0;
  local_c8 = &local_158;
  local_c0 = 0x140500000001;
  local_b8 = 0;
  local_b4 = 0;
  local_b0 = &local_158;
  lVar2 = 0x10;
  do {
    GVar3 = *(GLenum *)((long)&local_158.field_2 + lVar2 + 4);
    reference = *(GLenum *)((long)&local_158.field_2 + lVar2 + 8);
    glu::CallLogWrapper::glVertexAttribIPointer
              (this_00,0,*(GLint *)((long)&local_158.field_2 + lVar2),GVar3,reference,
               *(void **)((long)&local_138._M_dataplus._M_p + lVar2));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8625,GVar3,reference);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa0);
  tcu::TestLog::endSection(local_160.m_log);
  pTVar1 = (this->super_ApiCase).m_log;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"WithVAO","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_160,pTVar1,&local_138,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,(ulong)(local_138.field_2._M_allocated_capacity + 1))
    ;
  }
  local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffff00000000;
  local_138._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)&local_138);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&local_158);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)local_158._M_dataplus._M_p);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_138._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8625,0x1406,reference);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_138._M_dataplus._M_p._4_4_);
  GVar3 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1402,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8625,0x1402,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_138._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8625,0x1406,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)&local_138);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&local_158);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::TestLog::endSection(local_160.m_log);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			// test VertexAttribPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FIXED,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FLOAT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_HALF_FLOAT,							0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_FALSE, vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, pointers[ndx].type);
				}
			}

			// test glVertexAttribIPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, pointers[ndx].type);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_FLOAT);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_SHORT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_SHORT);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_FLOAT);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}